

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

int __thiscall common::Config::Init(Config *this,string *config_file)

{
  pointer pbVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  Host *this_00;
  Log *pLVar5;
  char cVar6;
  allocator local_319;
  shared_ptr<common::Host> host;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  string group;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string s;
  string local_258;
  ifstream infile;
  
  std::ifstream::ifstream(&infile,(config_file->_M_dataplus)._M_p,_S_in);
  std::__cxx11::string::string((string *)&group,anon_var_dwarf_f4 + 0xc,(allocator *)&s);
  local_2c0 = &this->m_group_names;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_2c0,&group);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      do {
        do {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&infile,(string *)&s);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
            pLVar5 = xlib::Log::Instance();
            std::__cxx11::string::string
                      ((string *)&local_2e0,"read host num %v ",(allocator *)&tags);
            vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)(this->m_hosts).
                                 super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_hosts).
                                 super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
            xlib::Log::SWrite<unsigned_long>
                      (pLVar5,LOG_PRIORITY_DEBUG,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                       ,0x38,"Init",true,&local_2e0,(unsigned_long *)&vec);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::ifstream::close();
            std::__cxx11::string::~string((string *)&s);
            std::__cxx11::string::~string((string *)&group);
            std::ifstream::~ifstream(&infile);
            return 0;
          }
          xlib::Trim(&s);
        } while (s._M_string_length == 0);
        cVar6 = (char)&s;
        lVar4 = std::__cxx11::string::find(cVar6,0x23);
      } while (lVar4 == 0);
      if (2 < s._M_string_length) break;
LAB_0010e618:
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_2e0," ",(allocator *)&tags);
      xlib::Split(&s,&local_2e0,&vec);
      std::__cxx11::string::~string((string *)&local_2e0);
      if ((ulong)((long)vec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x81) {
        pLVar5 = xlib::Log::Instance();
        std::__cxx11::string::string((string *)&local_2e0,"ignore %v",(allocator *)&tags);
        xlib::Log::SWrite<std::__cxx11::string>
                  (pLVar5,LOG_PRIORITY_DEBUG,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                   ,0x35,"Init",true,&local_2e0,&s);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
      else {
        this_00 = (Host *)operator_new(0xc0);
        Host::Host(this_00);
        std::__shared_ptr<common::Host,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<common::Host,void>
                  ((__shared_ptr<common::Host,(__gnu_cxx::_Lock_policy)2> *)&host,this_00);
        std::__cxx11::string::_M_assign
                  ((string *)
                   host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ip);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->user
                  );
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    password);
        std::__cxx11::string::string
                  ((string *)&local_258,
                   (string *)
                   (vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4));
        iVar2 = xlib::Stoi(&local_258);
        (host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->port =
             (uint16_t)iVar2;
        std::__cxx11::string::~string((string *)&local_258);
        pbVar1 = vec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0xa0 < (ulong)((long)vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vec.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::string::string((string *)&local_2e0,"|",&local_319);
          xlib::Split(pbVar1 + 5,&local_2e0,&tags);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     tags,&tags);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    group);
        std::vector<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
        ::push_back(&this->m_hosts,&host);
        pLVar5 = xlib::Log::Instance();
        std::__cxx11::string::string((string *)&local_2e0,"add host %v in group %v",&local_319);
        xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string>
                  (pLVar5,LOG_PRIORITY_DEBUG,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
                   ,0x33,"Init",true,&local_2e0,
                   &(host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    alias,&group);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tags);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&host.super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vec);
    }
    lVar4 = std::__cxx11::string::find(cVar6,0x5b);
    if (lVar4 != 0) goto LAB_0010e618;
    lVar4 = std::__cxx11::string::find(cVar6,0x5d);
    if (lVar4 == 0) goto LAB_0010e618;
    std::__cxx11::string::find(cVar6,0x5b);
    std::__cxx11::string::find(cVar6,0x5d);
    std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&s);
    std::__cxx11::string::operator=((string *)&group,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_2c0,&group);
    pLVar5 = xlib::Log::Instance();
    std::__cxx11::string::string((string *)&local_2e0,"set group %v",(allocator *)&vec);
    xlib::Log::SWrite<std::__cxx11::string>
              (pLVar5,LOG_PRIORITY_DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/config.cc"
               ,0x1f,"Init",true,&local_2e0,&group);
    std::__cxx11::string::~string((string *)&local_2e0);
  } while( true );
}

Assistant:

int Config::Init(const std::string& config_file) {
    std::ifstream infile(config_file.data());

    std::string group("");
    m_group_names.push_back(group);
    std::string s;
    while (getline(infile, s)) {
        xlib::Trim(s);
        if (s.size() == 0 || s.find('#') == 0) {
            continue;
        }

        if (s.size() > 2 && s.find('[') == 0 && s.find(']') > 0) {
            group = s.substr(s.find('[')+1, s.find(']')-1);
            m_group_names.push_back(group);
            XDBG("set group %v", group);
            continue;
        }
        std::vector<std::string> vec;
        xlib::Split(s, " ",  &vec);
        if (vec.size() >= 5) {
            cxx::shared_ptr<Host> host(new Host);
            host->alias = vec[0];
            host->ip    = vec[1];
            host->user  = vec[2];
            host->password = vec[3];
            host->port     = static_cast<uint32_t>(xlib::Stoi(vec[4]));

            std::vector<std::string> tags;
            if (vec.size() >= 6) {
                xlib::Split(vec[5], "|", &tags);
            }
            host->tags = tags;
            host->group = group;
            m_hosts.push_back(host);
            XDBG("add host %v in group %v", host->alias, group);
        } else {
            XDBG("ignore %v", s);
        }
    }
    XDBG("read host num %v ", m_hosts.size());
    infile.close();
    return 0;
}